

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::~Singleton
          (Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *this)

{
  pointer puVar1;
  
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&(this->super_StringStreams).m_referenceStream);
  std::ios_base::~ios_base((ios_base *)&(this->super_StringStreams).field_0xa0);
  puVar1 = (this->super_StringStreams).m_unused.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_StringStreams).m_unused.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  clara::std::
  vector<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&(this->super_StringStreams).m_streams);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }